

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness.c
# Opt level: O2

Vec_Ptr_t * populateSafetyAssertionVector(Abc_Ntk_t *pNtk,Aig_Man_t *pAig)

{
  int iVar1;
  Vec_Ptr_t *p;
  Abc_Obj_t *pNode;
  Aig_Obj_t *Entry;
  uint uVar2;
  int i;
  
  p = Vec_PtrAlloc(100);
  uVar2 = 0;
  i = 0;
  do {
    if (pNtk->vPos->nSize <= i) {
      printf("Number of safety property found = %d\n",(ulong)uVar2);
      return p;
    }
    pNode = Abc_NtkPo(pNtk,i);
    iVar1 = nodeName_starts_with(pNode,"assert_safety");
    if (iVar1 == 0) {
      iVar1 = nodeName_starts_with(pNode,"Assert");
      if (iVar1 != 0) goto LAB_0050634a;
    }
    else {
LAB_0050634a:
      Entry = Aig_ManCo(pAig,i);
      Vec_PtrPush(p,Entry);
      uVar2 = uVar2 + 1;
    }
    i = i + 1;
  } while( true );
}

Assistant:

Vec_Ptr_t * populateSafetyAssertionVector( Abc_Ntk_t *pNtk, Aig_Man_t *pAig )
{
    Abc_Obj_t * pNode;
    int i, assertSafetyCounter = 0;
    Vec_Ptr_t * vAssertSafety;

    vAssertSafety = Vec_PtrAlloc( 100 );
    Abc_NtkForEachPo( pNtk, pNode, i )
        //if( strstr( Abc_ObjName( pNode ), "Assert") != NULL )
        if( nodeName_starts_with( pNode, "assert_safety" ) || nodeName_starts_with( pNode, "Assert" ))
        {
            Vec_PtrPush( vAssertSafety, Aig_ManCo( pAig, i ) );
            assertSafetyCounter++;
        }
    printf("Number of safety property found = %d\n", assertSafetyCounter);
    return vAssertSafety;
}